

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

void __thiscall QCommandLineParser::showVersion(QCommandLineParser *this)

{
  longlong __old_val_2;
  QTypedArrayData<char16_t> *__old_val;
  char16_t *__old_val_1;
  long in_FS_OFFSET;
  QString local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined2 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t> local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::applicationName();
  QCoreApplication::applicationVersion();
  local_88 = 0x20;
  local_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_68.a.a.b = L' ';
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  local_68.b = L'\n';
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>::
  convertTo<QString>(&local_b8,&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    showMessageAndExit(Information,&local_b8,0);
  }
  __stack_chk_fail();
}

Assistant:

Q_NORETURN void QCommandLineParser::showVersion()
{
    showMessageAndExit(MessageType::Information,
                       QCoreApplication::applicationName() + u' '
                       + QCoreApplication::applicationVersion() + u'\n',
                       EXIT_SUCCESS);
}